

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O2

void tty_bind_char(EditLine *el,wchar_t force)

{
  byte bVar1;
  byte bVar2;
  el_action_t *map;
  el_action_t *map_00;
  el_action_t **ppeVar3;
  long lVar4;
  el_action_t *peVar5;
  wchar_t old [2];
  wchar_t new [2];
  wchar_t local_48 [2];
  wchar_t local_40 [2];
  el_action_t *local_38;
  
  local_48[1] = 0;
  local_40[1] = 0;
  if ((el->el_map).type == L'\x01') {
    ppeVar3 = &(el->el_map).vii;
    peVar5 = (el->el_map).vic;
  }
  else {
    ppeVar3 = &(el->el_map).emacs;
    peVar5 = (el_action_t *)0x0;
  }
  map = (el->el_map).alt;
  map_00 = (el->el_map).key;
  local_38 = *ppeVar3;
  for (lVar4 = 0x11ebc8; (ulong)*(uint *)(lVar4 + -8) != 0xffffffff; lVar4 = lVar4 + 0xc) {
    bVar1 = (el->el_tty).t_c[1][*(uint *)(lVar4 + -8)];
    local_40[0] = (wchar_t)bVar1;
    bVar2 = (el->el_tty).t_ed.c_cc[*(uint *)(lVar4 + -4)];
    local_48[0] = (wchar_t)bVar2;
    if ((force != L'\0') || (bVar1 != bVar2)) {
      keymacro_clear(el,map_00,local_48);
      map_00[(byte)local_48[0]] = local_38[(byte)local_48[0]];
      keymacro_clear(el,map_00,local_40);
      map_00[(byte)local_40[0]] = *(el_action_t *)(lVar4 + (el->el_map).type);
      if (peVar5 != (el_action_t *)0x0) {
        keymacro_clear(el,map,local_48);
        map[(byte)local_48[0]] = peVar5[(byte)local_48[0]];
        keymacro_clear(el,map,local_40);
        map[(byte)local_40[0]] = *(el_action_t *)(lVar4 + 1 + (long)(el->el_map).type);
      }
    }
  }
  return;
}

Assistant:

libedit_private void
tty_bind_char(EditLine *el, int force)
{

	unsigned char *t_n = el->el_tty.t_c[ED_IO];
	unsigned char *t_o = el->el_tty.t_ed.c_cc;
	wchar_t new[2], old[2];
	const ttymap_t *tp;
	el_action_t *map, *alt;
	const el_action_t *dmap, *dalt;
	new[1] = old[1] = '\0';

	map = el->el_map.key;
	alt = el->el_map.alt;
	if (el->el_map.type == MAP_VI) {
		dmap = el->el_map.vii;
		dalt = el->el_map.vic;
	} else {
		dmap = el->el_map.emacs;
		dalt = NULL;
	}

	for (tp = tty_map; tp->nch != (wint_t)-1; tp++) {
		new[0] = (wchar_t)t_n[tp->nch];
		old[0] = (wchar_t)t_o[tp->och];
		if (new[0] == old[0] && !force)
			continue;
		/* Put the old default binding back, and set the new binding */
		keymacro_clear(el, map, old);
		map[(unsigned char)old[0]] = dmap[(unsigned char)old[0]];
		keymacro_clear(el, map, new);
		/* MAP_VI == 1, MAP_EMACS == 0... */
		map[(unsigned char)new[0]] = tp->bind[el->el_map.type];
		if (dalt) {
			keymacro_clear(el, alt, old);
			alt[(unsigned char)old[0]] =
			    dalt[(unsigned char)old[0]];
			keymacro_clear(el, alt, new);
			alt[(unsigned char)new[0]] =
			    tp->bind[el->el_map.type + 1];
		}
	}
}